

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

int FIX::socket_setsockopt(socket_handle s,int opt)

{
  int iVar1;
  
  iVar1 = socket_setsockopt(s,opt,1);
  return iVar1;
}

Assistant:

int socket_setsockopt(socket_handle s, int opt) {
#ifdef _MSC_VER
  BOOL optval = TRUE;
#else
  int optval = 1;
#endif
  return socket_setsockopt(s, opt, optval);
}